

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS ref_egads_invert(REF_GEOM ref_geom,REF_INT type,REF_INT id,REF_DBL *xyz0,REF_DBL *uv)

{
  REF_DBL xyz [3];
  REF_DBL dxyz_dtuv [15];
  REF_DBL aRStack_98 [4];
  REF_DBL local_78 [15];
  
  ref_egads_eval_at(ref_geom,type,id,xyz0,aRStack_98,local_78);
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xed0,
         "ref_egads_invert",6,"eval");
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_invert(REF_GEOM ref_geom, REF_INT type, REF_INT id,
                                    REF_DBL *xyz0, REF_DBL *uv) {
  REF_DBL xyz[3], error[3];
  REF_DBL dxyz_dtuv[15];
  REF_DBL drsduv[4], duvdrs[4];
  REF_DBL r[3], s[3], n[3];
  REF_DBL drs[2], duv[2];
  REF_INT i;
  REF_DBL tol = 1.0e-14;
  REF_BOOL verbose = REF_FALSE;

  for (i = 0; i < 20; i++) {
    RSS(ref_egads_eval_at(ref_geom, type, id, uv, xyz, dxyz_dtuv), "eval");
    error[0] = xyz[0] - xyz0[0];
    error[1] = xyz[1] - xyz0[1];
    error[2] = xyz[2] - xyz0[2];
    RSS(ref_geom_face_rsn(ref_geom, id, uv, r, s, n), "rsn");
    /* [x_u,y_u,z_u] [x_v,y_v,z_v] */
    /*  drsduv = [r s] * dxyz_dtuv */
    drsduv[0] = dxyz_dtuv[0] * r[0] + dxyz_dtuv[1] * r[1] + dxyz_dtuv[2] * r[2];
    drsduv[1] = dxyz_dtuv[0] * s[0] + dxyz_dtuv[1] * s[1] + dxyz_dtuv[2] * s[2];
    drsduv[2] = dxyz_dtuv[3] * r[0] + dxyz_dtuv[4] * r[1] + dxyz_dtuv[5] * r[2];
    drsduv[3] = dxyz_dtuv[3] * s[0] + dxyz_dtuv[4] * s[1] + dxyz_dtuv[5] * s[2];
    RSS(ref_matrix_inv_gen(2, drsduv, duvdrs), "inv");
    drs[0] = ref_math_dot(r, error);
    drs[1] = ref_math_dot(s, error);
    if (verbose)
      printf(" r %e s %e err %e on %d\n", drs[0], drs[1],
             sqrt(ref_math_dot(error, error)), i);
    duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
    duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
    uv[0] = uv[0] - duv[0];
    uv[1] = uv[1] - duv[1];
    if (sqrt(drs[0] * drs[0] + drs[1] * drs[1]) < tol) {
      return REF_SUCCESS;
    }
  }
  return REF_FAILURE;
}